

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

string * __thiscall
ftxui::Screen::ResetPosition_abi_cxx11_(string *__return_storage_ptr__,Screen *this,bool clear)

{
  int local_1bc;
  int local_1b8;
  int y_1;
  int y;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [383];
  byte local_19;
  Screen *pSStack_18;
  bool clear_local;
  Screen *this_local;
  
  local_19 = clear;
  pSStack_18 = this;
  this_local = (Screen *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  if ((local_19 & 1) == 0) {
    std::operator<<(local_198,"\r");
    for (local_1bc = 1; local_1bc < this->dimy_; local_1bc = local_1bc + 1) {
      std::operator<<(local_198,"\x1b[1A");
    }
  }
  else {
    std::operator<<(local_198,"\r");
    std::operator<<(local_198,"\x1b[2K");
    for (local_1b8 = 1; local_1b8 < this->dimy_; local_1b8 = local_1b8 + 1) {
      std::operator<<(local_198,"\x1b[1A");
      std::operator<<(local_198,"\x1b[2K");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::ResetPosition(bool clear) const {
  std::stringstream ss;
  if (clear) {
    ss << "\r";       // MOVE_LEFT;
    ss << "\x1b[2K";  // CLEAR_SCREEN;
    for (int y = 1; y < dimy_; ++y) {
      ss << "\x1B[1A";  // MOVE_UP;
      ss << "\x1B[2K";  // CLEAR_LINE;
    }
  } else {
    ss << "\r";  // MOVE_LEFT;
    for (int y = 1; y < dimy_; ++y) {
      ss << "\x1B[1A";  // MOVE_UP;
    }
  }
  return ss.str();
}